

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileFromDatabase
          (DescriptorPool *this,FileDescriptorProto *proto)

{
  size_type sVar1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  FileDescriptor *result;
  key_type *in_stack_fffffffffffffe88;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  DescriptorBuilder *this_00;
  value_type *__x;
  Tables *in_stack_fffffffffffffed8;
  Tables *in_stack_fffffffffffffee0;
  DescriptorBuilder *in_stack_fffffffffffffee8;
  DescriptorBuilder *in_stack_fffffffffffffef0;
  value_type *local_8;
  
  internal::WrappedMutex::AssertHeld((WrappedMutex *)(in_RDI->_M_h)._M_buckets);
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x6224ea);
  FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x622500);
  sVar1 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  if (sVar1 == 0) {
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::get((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
           *)in_stack_fffffffffffffe90);
    this_00 = (DescriptorBuilder *)&stack0xfffffffffffffed0;
    DescriptorBuilder::DescriptorBuilder
              (in_stack_fffffffffffffef0,(DescriptorPool *)in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee0,(ErrorCollector *)in_stack_fffffffffffffed8);
    local_8 = (value_type *)
              DescriptorBuilder::BuildFile
                        (in_stack_fffffffffffffee8,(FileDescriptorProto *)in_stack_fffffffffffffee0)
    ;
    DescriptorBuilder::~DescriptorBuilder(this_00);
    if (local_8 == (value_type *)0x0) {
      __x = local_8;
      std::
      unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
      ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                    *)0x622596);
      FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x6225ab);
      std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(in_RDI,__x);
    }
  }
  else {
    local_8 = (value_type *)0x0;
  }
  return (FileDescriptor *)local_8;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileFromDatabase(
    const FileDescriptorProto& proto) const {
  mutex_->AssertHeld();
  if (tables_->known_bad_files_.count(proto.name()) > 0) {
    return nullptr;
  }
  const FileDescriptor* result =
      DescriptorBuilder(this, tables_.get(), default_error_collector_)
          .BuildFile(proto);
  if (result == nullptr) {
    tables_->known_bad_files_.insert(proto.name());
  }
  return result;
}